

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::BeginPopupEx(ImGuiID id,ImGuiWindowFlags extra_flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ulong uVar3;
  char *fmt;
  char name [20];
  
  pIVar1 = GImGui;
  uVar3 = (ulong)id;
  bVar2 = IsPopupOpen(id);
  if (bVar2) {
    if (((uint)extra_flags >> 0x1c & 1) == 0) {
      fmt = "##Popup_%08x";
    }
    else {
      uVar3 = (ulong)(uint)(pIVar1->CurrentPopupStack).Size;
      fmt = "##Menu_%02d";
    }
    ImFormatString(name,0x14,fmt,uVar3);
    bVar2 = Begin(name,(bool *)0x0,extra_flags | 0x4000000);
    if (!bVar2) {
      EndPopup();
    }
  }
  else {
    (pIVar1->NextWindowData).CollapsedCond = 0;
    (pIVar1->NextWindowData).SizeConstraintCond = 0;
    (pIVar1->NextWindowData).FocusCond = 0;
    (pIVar1->NextWindowData).BgAlphaCond = 0;
    (pIVar1->NextWindowData).PosCond = 0;
    (pIVar1->NextWindowData).SizeCond = 0;
    (pIVar1->NextWindowData).ContentSizeCond = 0;
    (pIVar1->NextWindowData).CollapsedCond = 0;
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImGui::BeginPopupEx(ImGuiID id, ImGuiWindowFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    if (!IsPopupOpen(id))
    {
        g.NextWindowData.Clear(); // We behave like Begin() and need to consume those values
        return false;
    }

    char name[20];
    if (extra_flags & ImGuiWindowFlags_ChildMenu)
        ImFormatString(name, IM_ARRAYSIZE(name), "##Menu_%02d", g.CurrentPopupStack.Size);    // Recycle windows based on depth
    else
        ImFormatString(name, IM_ARRAYSIZE(name), "##Popup_%08x", id); // Not recycling, so we can close/open during the same frame

    bool is_open = Begin(name, NULL, extra_flags | ImGuiWindowFlags_Popup);
    if (!is_open) // NB: Begin can return false when the popup is completely clipped (e.g. zero size display)
        EndPopup();

    return is_open;
}